

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

int __thiscall ON_Mesh::SolidOrientation(ON_Mesh *this)

{
  char cVar1;
  ON_Mesh *this_local;
  
  if ((this->m_mesh_is_solid < '\x01') || ('\x03' < this->m_mesh_is_solid)) {
    IsSolid(this);
  }
  cVar1 = this->m_mesh_is_solid;
  if (cVar1 == '\x01') {
    this_local._4_4_ = 1;
  }
  else if (cVar1 == '\x02') {
    this_local._4_4_ = -1;
  }
  else if (cVar1 == '\x03') {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int ON_Mesh::SolidOrientation() const
{

  if ( m_mesh_is_solid <= 0 || m_mesh_is_solid > 3 )
  {
    // NOTE: calling IsClosed() will set m_mesh_is_solid
    //       to 3 if mes is non-manifold
    if ( IsSolid() )
    {
    }
  }

  switch(m_mesh_is_solid)
  {
  case 1:
    return 1;
    break;

  case 2:
    return -1;
    break;

  case 3:
    return 0;
    break;
  }

  return 0; // answer "no" if we don't know.
}